

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options_boost_po.h
# Opt level: O1

bool __thiscall
VW::config::options_boost_po::try_get_positional_option_token
          (options_boost_po *this,string *key,string *token,int position)

{
  __normal_iterator<boost::program_options::basic_option<char>_*,_std::vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>_>
  _Var1;
  bool bVar2;
  parsed_options pos;
  positional_options_description p;
  basic_parsed_options<char> local_100;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_d8;
  undefined1 *local_c0;
  undefined1 local_b0 [16];
  undefined1 local_a0 [80];
  function1<std::vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&>
  local_50 [32];
  options_description *local_30;
  
  boost::program_options::positional_options_description::positional_options_description
            ((positional_options_description *)&local_d8);
  boost::program_options::positional_options_description::add
            ((char *)&local_d8,(int)(key->_M_dataplus)._M_p);
  boost::program_options::basic_command_line_parser<char>::basic_command_line_parser
            ((basic_command_line_parser<char> *)local_a0,&this->m_command_line);
  boost::program_options::detail::cmdline::style((int)local_a0);
  boost::program_options::detail::cmdline::set_options_description((options_description *)local_a0);
  local_30 = &this->master_description;
  boost::program_options::detail::cmdline::allow_unregistered();
  boost::program_options::detail::cmdline::set_positional_options
            ((positional_options_description *)local_a0);
  boost::program_options::basic_command_line_parser<char>::run
            (&local_100,(basic_command_line_parser<char> *)local_a0);
  boost::
  function1<std::vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&>
  ::~function1(local_50);
  boost::
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~function1((function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)(local_a0 + 0x30));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_a0);
  _Var1 = std::
          __find_if<__gnu_cxx::__normal_iterator<boost::program_options::basic_option<char>*,std::vector<boost::program_options::basic_option<char>,std::allocator<boost::program_options::basic_option<char>>>>,__gnu_cxx::__ops::_Iter_pred<VW::config::options_boost_po::try_get_positional_option_token(std::__cxx11::string_const&,std::__cxx11::string&,int)::_lambda(boost::program_options::basic_option<char>)_1_>>
                    (local_100.options.
                     super__Vector_base<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     local_100.options.
                     super__Vector_base<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,key);
  if ((_Var1._M_current ==
       local_100.options.
       super__Vector_base<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
       ._M_impl.super__Vector_impl_data._M_finish) ||
     (((_Var1._M_current)->value).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      ((_Var1._M_current)->value).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start)) {
    bVar2 = false;
  }
  else {
    bVar2 = true;
    std::__cxx11::string::_M_assign((string *)token);
  }
  std::
  vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
  ::~vector(&local_100.options);
  if (local_c0 != local_b0) {
    operator_delete(local_c0);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_d8);
  return bVar2;
}

Assistant:

bool try_get_positional_option_token(const std::string& key, std::string& token, int position)
  {
    po::positional_options_description p;
    p.add(key.c_str(), position);
    po::parsed_options pos = po::command_line_parser(m_command_line)
                                 .style(po::command_line_style::default_style ^ po::command_line_style::allow_guessing)
                                 .options(master_description)
                                 .allow_unregistered()
                                 .positional(p)
                                 .run();

    auto it = std::find_if(pos.options.begin(), pos.options.end(),
        [&key](boost::program_options::option option) { return option.string_key == key; });

    if (it != pos.options.end() && (*it).value.size() > 0)
    {
      token = (*it).value.at(0);
      return true;
    }

    return false;
  }